

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libeconf.c
# Opt level: O0

econf_err econf_getKeys(econf_file *kf,char *grp,size_t *length,char ***keys)

{
  int iVar1;
  void *__ptr;
  char **ppcVar2;
  char *pcVar3;
  char *local_68;
  long local_60;
  size_t j;
  size_t i_1;
  size_t i;
  _Bool *uniques;
  char *group;
  size_t tmp;
  char ***keys_local;
  size_t *length_local;
  char *grp_local;
  econf_file *kf_local;
  
  if (length != (size_t *)0x0) {
    *length = 0;
  }
  if (kf == (econf_file *)0x0) {
    kf_local._4_4_ = ECONF_ERROR;
  }
  else {
    group = (char *)0x0;
    if ((grp == (char *)0x0) || (*grp == '\0')) {
      local_68 = strdup("_none_");
    }
    else {
      local_68 = strdup(grp);
    }
    if (local_68 == (char *)0x0) {
      kf_local._4_4_ = ECONF_NOMEM;
    }
    else {
      __ptr = calloc(kf->length,1);
      if (__ptr == (void *)0x0) {
        free(local_68);
        kf_local._4_4_ = ECONF_NOMEM;
      }
      else {
        for (i_1 = 0; i_1 < kf->length; i_1 = i_1 + 1) {
          iVar1 = strcmp(kf->file_entry[i_1].group,local_68);
          if (iVar1 == 0) {
            *(undefined1 *)((long)__ptr + i_1) = 1;
            group = group + 1;
          }
        }
        free(local_68);
        if (group == (char *)0x0) {
          free(__ptr);
          kf_local._4_4_ = ECONF_NOKEY;
        }
        else {
          ppcVar2 = (char **)calloc((size_t)(group + 1),8);
          *keys = ppcVar2;
          if (*keys == (char **)0x0) {
            free(__ptr);
            kf_local._4_4_ = ECONF_NOMEM;
          }
          else {
            local_60 = 0;
            for (j = 0; j < kf->length; j = j + 1) {
              if ((*(byte *)((long)__ptr + j) & 1) != 0) {
                pcVar3 = strdup(kf->file_entry[j].key);
                (*keys)[local_60] = pcVar3;
                local_60 = local_60 + 1;
              }
            }
            if (length != (size_t *)0x0) {
              *length = (size_t)group;
            }
            free(__ptr);
            kf_local._4_4_ = ECONF_SUCCESS;
          }
        }
      }
    }
  }
  return kf_local._4_4_;
}

Assistant:

econf_err
econf_getKeys(econf_file *kf, const char *grp, size_t *length, char ***keys)
{
  if (length != NULL)
    *length = 0; /* initialize */
  if (!kf)
    return ECONF_ERROR;

  size_t tmp = 0;
  char *group = (!grp || !*grp) ? strdup(KEY_FILE_NULL_VALUE) : strdup(grp);
  if (group == NULL)
    return ECONF_NOMEM;

  bool *uniques = calloc(kf->length, sizeof(bool));
  if (uniques == NULL)
    {
      free(group);
      return ECONF_NOMEM;
    }
  for (size_t i = 0; i < kf->length; i++) {
    if (!strcmp(kf->file_entry[i].group, group)) {
      uniques[i] = 1;
      tmp++;
    }
  }
  free(group);
  if (!tmp)
    {
      free (uniques);
      return ECONF_NOKEY;
    }
  *keys = calloc(tmp + 1, sizeof(char*));
  if (*keys == NULL) {
    free (uniques);
    return ECONF_NOMEM;
  }

  for (size_t i = 0, j = 0; i < kf->length; i++)
    if (uniques[i])
      (*keys)[j++] = strdup(kf->file_entry[i].key);

  if (length != NULL)
    *length = tmp;

  free(uniques);
  return ECONF_SUCCESS;
}